

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

bool llvm::hashing::detail::store_and_advance<unsigned_char>
               (char **buffer_ptr,char *buffer_end,uchar *value,size_t offset)

{
  char *pcVar1;
  size_t __n;
  char *value_data;
  size_t store_size;
  size_t offset_local;
  uchar *value_local;
  char *buffer_end_local;
  char **buffer_ptr_local;
  
  __n = 1 - offset;
  pcVar1 = *buffer_ptr;
  if (pcVar1 + __n <= buffer_end) {
    memcpy(*buffer_ptr,value + offset,__n);
    *buffer_ptr = *buffer_ptr + __n;
  }
  return pcVar1 + __n <= buffer_end;
}

Assistant:

bool store_and_advance(char *&buffer_ptr, char *buffer_end, const T& value,
                       size_t offset = 0) {
  size_t store_size = sizeof(value) - offset;
  if (buffer_ptr + store_size > buffer_end)
    return false;
  const char *value_data = reinterpret_cast<const char *>(&value);
  memcpy(buffer_ptr, value_data + offset, store_size);
  buffer_ptr += store_size;
  return true;
}